

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_channels.cpp
# Opt level: O1

bool __thiscall ON_RenderChannels::operator==(ON_RenderChannels *this,ON_RenderChannels *rch)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ON_wString s2;
  ON_wString s1;
  ON_ClassArray<ON_wString> b;
  ON_ClassArray<ON_wString> a;
  undefined1 auStack_58 [16];
  ON_ClassArray<ON_wString> local_48;
  ON_ClassArray<ON_wString> local_30;
  
  iVar2 = (*this->_vptr_ON_RenderChannels[5])();
  iVar3 = (*rch->_vptr_ON_RenderChannels[5])(rch);
  if (iVar2 == iVar3) {
    local_30._vptr_ON_ClassArray = (_func_int **)&PTR__ON_ClassArray_008179b0;
    local_30.m_a = (ON_wString *)0x0;
    local_30.m_count = 0;
    local_30.m_capacity = 0;
    local_48._vptr_ON_ClassArray = (_func_int **)&PTR__ON_ClassArray_008179b0;
    local_48.m_a = (ON_wString *)0x0;
    local_48.m_count = 0;
    local_48.m_capacity = 0;
    GetSortedCustomListAsString((ON_RenderChannels *)(auStack_58 + 8));
    GetSortedCustomListAsString((ON_RenderChannels *)auStack_58);
    bVar1 = ::operator!=((ON_wString *)(auStack_58 + 8),(ON_wString *)auStack_58);
    bVar1 = !bVar1;
    ON_wString::~ON_wString((ON_wString *)auStack_58);
    ON_wString::~ON_wString((ON_wString *)(auStack_58 + 8));
    ON_ClassArray<ON_wString>::~ON_ClassArray(&local_48);
    ON_ClassArray<ON_wString>::~ON_ClassArray(&local_30);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ON_RenderChannels::operator == (const ON_RenderChannels& rch) const
{
  if (Mode() != rch.Mode())
    return false;

  ON_ClassArray<ON_wString> a, b;
  const ON_wString s1 = GetSortedCustomListAsString(*this);
  const ON_wString s2 = GetSortedCustomListAsString(rch);
  if (s1 != s2)
    return false;

  return true;
}